

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_MoveToPlayer(void)

{
  Task *in_RDI;
  value_type local_68;
  value_type local_60;
  value_type local_58 [2];
  allocator<char> local_39;
  string local_38;
  undefined1 local_11;
  Task *move;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"moveToPlayer",&local_39);
  Task::Task(in_RDI,&local_38,Simple);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  in_RDI->action = MoveToPlayer;
  local_58[0].id = Alertness;
  local_58[0].op = GreaterEqual;
  local_58[0].value = 80.0;
  std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>::push_back
            (&(in_RDI->preconditions).requiredValues,local_58);
  local_60.id = PlayerIdentified;
  local_60.flag = true;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::push_back
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,&local_60);
  local_68.identifier = NearPlayer;
  local_68.index = -1;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  push_back(&(in_RDI->postconditions).satisfiedPredicates,&local_68);
  return in_RDI;
}

Assistant:

Task create_MoveToPlayer()
	{
		Task move {"moveToPlayer"};
		move.action = Action::MoveToPlayer;
		move.preconditions.requiredValues.push_back({WorldStateIdentifier::Alertness, ConditionOp::GreaterEqual, 80.f});
		move.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, true});
		
		move.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer, -1});

		return move;
	}